

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O3

void __thiscall Fl_Image::draw_empty(Fl_Image *this,int X,int Y)

{
  if ((0 < this->w_) && (0 < this->h_)) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[3])
              (fl_graphics_driver,(ulong)(uint)X,(ulong)(uint)Y,(ulong)(uint)this->w_,
               (ulong)(uint)this->h_);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
              (fl_graphics_driver,(ulong)(uint)X,(ulong)(uint)Y,(ulong)(uint)(this->w_ + X + -1),
               (ulong)(uint)(this->h_ + Y + -1));
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
              (fl_graphics_driver,(ulong)(uint)X,(ulong)(uint)(Y + -1 + this->h_),
               (ulong)(uint)(X + -1 + this->w_),(ulong)(uint)Y);
    return;
  }
  return;
}

Assistant:

void Fl_Image::draw_empty(int X, int Y) {
  if (w() > 0 && h() > 0) {
    fl_color(FL_FOREGROUND_COLOR);
    fl_rect(X, Y, w(), h());
    fl_line(X, Y, X + w() - 1, Y + h() - 1);
    fl_line(X, Y + h() - 1, X + w() - 1, Y);
  }
}